

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::Parser::ParseChunk
          (Parser *this,StringPiece chunk,string *out_error)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  StringPiece line;
  StringPiece local_78;
  StringPiece local_68;
  StringPiece local_58;
  string local_48;
  
  local_58.length_ = chunk.length_;
  local_58.ptr_ = chunk.ptr_;
  local_78.ptr_ = local_58.ptr_;
  local_78.length_ = local_58.length_;
  if ((this->leftover_)._M_string_length != 0) {
    stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_48,&local_58);
    std::__cxx11::string::_M_append((char *)&this->leftover_,(ulong)local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    local_78.ptr_ = (this->leftover_)._M_dataplus._M_p;
    local_78.length_ = (this->leftover_)._M_string_length;
    if ((long)local_78.length_ < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (local_78.length_,"string length exceeds max size");
    }
  }
  local_68.ptr_ = (char *)0x0;
  local_68.length_ = 0;
  bVar2 = ReadLine(&local_78,&local_68);
  if (!bVar2) {
LAB_00270ea9:
    if (local_78.length_ == 0) {
      (this->leftover_)._M_string_length = 0;
      *(this->leftover_)._M_dataplus._M_p = '\0';
    }
    else {
      stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_48,&local_78);
      std::__cxx11::string::operator=((string *)&this->leftover_,(string *)&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
    return true;
  }
LAB_00270e0c:
  this->line_ = this->line_ + 1;
  RemoveComment(&local_68);
  pbVar1 = (byte *)local_68.ptr_;
  sVar4 = local_68.length_;
  for (sVar5 = local_68.length_; sVar5 != 0; sVar5 = sVar5 - 1) {
    sVar4 = sVar4 - 1;
    if ((4 < *pbVar1 - 9) && (*pbVar1 != 0x20)) {
      local_68.ptr_ = local_68.ptr_ + local_68.length_;
      local_68.length_ = sVar5;
      goto LAB_00270e63;
    }
    pbVar1 = pbVar1 + 1;
  }
  goto LAB_00270e96;
  while (sVar4 = sVar5 - 1, local_68.length_ = sVar5, sVar5 != 0) {
LAB_00270e63:
    sVar5 = sVar4;
    local_68.ptr_ = (char *)((byte *)local_68.ptr_ + -1);
    if ((4 < (byte)*local_68.ptr_ - 9) && (*local_68.ptr_ != 0x20)) {
      local_68.ptr_ = (char *)pbVar1;
      iVar3 = (*this->line_consumer_->_vptr_LineConsumer[2])
                        (this->line_consumer_,&local_68,out_error);
      pbVar1 = (byte *)local_68.ptr_;
      sVar5 = local_68.length_;
      if ((char)iVar3 == '\0') {
        if (out_error->_M_string_length == 0) {
          std::__cxx11::string::_M_replace((ulong)out_error,0,(char *)0x0,0x3e7205);
        }
        (this->leftover_)._M_string_length = 0;
        *(this->leftover_)._M_dataplus._M_p = '\0';
        return false;
      }
      break;
    }
  }
LAB_00270e96:
  local_68.length_ = sVar5;
  local_68.ptr_ = (char *)pbVar1;
  bVar2 = ReadLine(&local_78,&local_68);
  if (!bVar2) goto LAB_00270ea9;
  goto LAB_00270e0c;
}

Assistant:

bool Parser::ParseChunk(StringPiece chunk, std::string* out_error) {
  StringPiece full_chunk;
  if (!leftover_.empty()) {
    leftover_ += std::string(chunk);
    full_chunk = StringPiece(leftover_);
  } else {
    full_chunk = chunk;
  }

  StringPiece line;
  while (ReadLine(&full_chunk, &line)) {
    ++line_;
    RemoveComment(&line);
    TrimWhitespace(&line);
    if (!line.empty() && !line_consumer_->ConsumeLine(line, out_error)) {
      if (out_error->empty()) {
        *out_error = "ConsumeLine failed without setting an error.";
      }
      leftover_.clear();
      return false;
    }
  }

  if (full_chunk.empty()) {
    leftover_.clear();
  } else {
    leftover_ = std::string(full_chunk);
  }
  return true;
}